

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O0

void __thiscall
TPZEulerAnalysis::SetGMResFront(TPZEulerAnalysis *this,REAL tol,int numiter,int numvectors)

{
  TPZCompMesh *this_00;
  TPZCompMesh *in_RDI;
  TPZStepSolver<double> Solver;
  TPZMatrix<double> *mat;
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> StrMatrix;
  TPZStepSolver<double> FrontSolver;
  TPZMatrix<double> *front;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> strfront;
  undefined8 in_stack_fffffffffffffbd8;
  DecomposeType decomp;
  TPZSolutionMatrix *in_stack_fffffffffffffbe0;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *this_01;
  TPZMatrixSolver<double> *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  TPZStructMatrix *in_stack_fffffffffffffc18;
  TPZAnalysis *in_stack_fffffffffffffc20;
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *in_stack_fffffffffffffca0;
  TPZAutoPointer<TPZGuiInterface> *in_stack_fffffffffffffcb0;
  TPZBaseMatrix *in_stack_fffffffffffffcb8;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>
  *in_stack_fffffffffffffcc0;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> local_f8;
  
  decomp = (DecomposeType)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  TPZAnalysis::Mesh((TPZAnalysis *)in_RDI);
  this_01 = &local_f8;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (this_01,in_RDI);
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::SetQuiet
            (this_01,1);
  TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(in_stack_fffffffffffffbe0);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)this_01,(TPZGuiInterface *)in_RDI);
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::CreateAssemble
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffbe0);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)this_01,(TPZMatrix<double> *)in_RDI);
  TPZStepSolver<double>::TPZStepSolver
            ((TPZStepSolver<double> *)in_stack_fffffffffffffc20,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffc18);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffbe0);
  TPZStepSolver<double>::SetDirect((TPZStepSolver<double> *)in_stack_fffffffffffffbe0,decomp);
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>
            ((TPZAutoPointer<TPZBaseMatrix> *)this_01,(TPZMatrix<double> *)in_RDI);
  TPZMatrixSolver<double>::SetMatrix
            ((TPZMatrixSolver<double> *)
             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
             (TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffc08);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffbe0);
  this_00 = TPZAnalysis::Mesh((TPZAnalysis *)in_RDI);
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            ((TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *)this_01,in_RDI);
  TPZAnalysis::SetStructuralMatrix(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::Create(in_stack_fffffffffffffca0);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)this_01,(TPZMatrix<double> *)in_RDI);
  TPZStepSolver<double>::TPZStepSolver
            ((TPZStepSolver<double> *)in_stack_fffffffffffffc20,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffc18);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)this_00)
  ;
  TPZStepSolver<double>::SetGMRES
            ((TPZStepSolver<double> *)in_stack_fffffffffffffc20,(int64_t)in_stack_fffffffffffffc18,
             in_stack_fffffffffffffc14,in_stack_fffffffffffffc08,(REAL)this_01,(int64_t)in_RDI);
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>
            ((TPZAutoPointer<TPZBaseMatrix> *)this_01,(TPZMatrix<double> *)in_RDI);
  TPZMatrixSolver<double>::SetMatrix
            ((TPZMatrixSolver<double> *)
             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
             (TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffc08);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer((TPZAutoPointer<TPZBaseMatrix> *)this_00);
  (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,&stack0xfffffffffffffc18);
  *(undefined4 *)
   ((long)&(in_RDI->fSolN).fComplexMatrix.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix
           .super_TPZSavable._vptr_TPZSavable + 4) = 0;
  TPZStepSolver<double>::~TPZStepSolver((TPZStepSolver<double> *)0x1c5c01e);
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::~TPZSpStructMatrix
            ((TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *)this_00);
  TPZStepSolver<double>::~TPZStepSolver((TPZStepSolver<double> *)0x1c5c038);
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::
  ~TPZFrontStructMatrix
            ((TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *)
             this_00);
  return;
}

Assistant:

void TPZEulerAnalysis::SetGMResFront(REAL tol, int numiter, int numvectors)
{
	TPZFrontStructMatrix <TPZFrontNonSym<STATE> > strfront(Mesh());
	strfront.SetQuiet(1);
	auto *front = strfront.CreateAssemble(fRhs,NULL);
	
	TPZStepSolver<STATE> FrontSolver;
	FrontSolver.SetDirect(ELU);
	FrontSolver.SetMatrix(front);
	
	
	TPZSpStructMatrix<STATE> StrMatrix(Mesh());
	//TPZFStructMatrix<STATE> StrMatrix(cmesh);
	SetStructuralMatrix(StrMatrix);
	
	auto * mat = StrMatrix.Create();
	TPZStepSolver<STATE> Solver;
	Solver.SetGMRES(numiter,
					numvectors,
					FrontSolver,
					tol,
					0);
	Solver.SetMatrix(mat);
	SetSolver(Solver);
	fHasFrontalPreconditioner = 0;
	
}